

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitSIMDShift(FunctionValidator *this,SIMDShift *curr)

{
  shouldBeTrue<wasm::SIMDShift*>
            (this,SUB41(((((this->
                           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                           ).
                           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                           .
                           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          .currModule)->features).features & 8) >> 3,0),curr,
             "SIMD operations require SIMD [--enable-simd]");
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDShift*,wasm::Type>
            (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)33>).super_Expression.
                        type.id,(Type)0x6,curr,"vector shift must have type v128");
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDShift*,wasm::Type>
            (this,(Type)(curr->vec->type).id,(Type)0x6,curr,"expected operand of type v128");
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDShift*,wasm::Type>
            (this,(Type)(curr->shift->type).id,(Type)0x2,curr,
             "expected shift amount to have type i32");
  return;
}

Assistant:

void FunctionValidator::visitSIMDShift(SIMDShift* curr) {
  shouldBeTrue(getModule()->features.hasSIMD(),
               curr,
               "SIMD operations require SIMD [--enable-simd]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->type, Type(Type::v128), curr, "vector shift must have type v128");
  shouldBeEqualOrFirstIsUnreachable(
    curr->vec->type, Type(Type::v128), curr, "expected operand of type v128");
  shouldBeEqualOrFirstIsUnreachable(curr->shift->type,
                                    Type(Type::i32),
                                    curr,
                                    "expected shift amount to have type i32");
}